

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto2JsonConflictError_Test::
TestBody(ParserValidationErrorTest_Proto2JsonConflictError_Test *this)

{
  ParserValidationErrorTest_Proto2JsonConflictError_Test *this_local;
  
  ParserTest::ExpectParsesTo
            (&this->super_ParserValidationErrorTest,
             "syntax = \'proto2\';\nmessage TestMessage {\n  optional uint32 _foo = 1;\n  optional uint32 Foo = 2;\n}\n"
             ,
             "syntax: \'proto2\'\nmessage_type {\n  name: \'TestMessage\'\n  field {\n    label: LABEL_OPTIONAL type: TYPE_UINT32 name: \'_foo\' number: 1\n  }\n  field {\n    label: LABEL_OPTIONAL type: TYPE_UINT32 name: \'Foo\' number: 2\n  }\n}\n"
            );
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2JsonConflictError) {
  ExpectParsesTo(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  optional uint32 _foo = 1;\n"
      "  optional uint32 Foo = 2;\n"
      "}\n",
      "syntax: 'proto2'\n"
      "message_type {\n"
      "  name: 'TestMessage'\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: '_foo' number: 1\n"
      "  }\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'Foo' number: 2\n"
      "  }\n"
      "}\n");
}